

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

QCborValueRef
QCborContainerPrivate::findOrAddMapKey<QCborValue_const&>
          (QCborContainerPrivate *container,QCborValue *key)

{
  long lVar1;
  long reserved;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QCborValueConstRef QVar3;
  QCborValueRef QVar4;
  QCborValue local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (container == (QCborContainerPrivate *)0x0) {
    lVar1 = 1;
    qVar2 = 0;
  }
  else {
    qVar2 = (container->elements).d.size;
    QVar3 = findCborMapKey<QCborValue_const&>(container,key);
    lVar1 = QVar3.i;
  }
  reserved = lVar1 + 1;
  if (lVar1 + 1 <= qVar2) {
    reserved = qVar2;
  }
  QVar4.super_QCborValueConstRef.d = detach(container,reserved);
  if (qVar2 <= lVar1) {
    append(QVar4.super_QCborValueConstRef.d,key);
    local_48.n = 0;
    local_48.container = (QCborContainerPrivate *)0x0;
    local_48.t = Undefined;
    append(QVar4.super_QCborValueConstRef.d,&local_48);
    QCborValue::~QCborValue((QCborValue *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar4.super_QCborValueConstRef.i = lVar1;
    return (QCborValueRef)QVar4.super_QCborValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

static QCborValueRef
    findOrAddMapKey(QCborContainerPrivate *container, KeyType key)
    {
        qsizetype size = 0;
        qsizetype index = size + 1;
        if (container) {
            size = container->elements.size();
            index = container->findCborMapKey<KeyType>(key).i; // returns size + 1 if not found
        }
        Q_ASSERT(index & 1);
        Q_ASSERT((size & 1) == 0);

        container = detach(container, qMax(index + 1, size));
        Q_ASSERT(container);
        Q_ASSERT((container->elements.size() & 1) == 0);

        if (index >= size) {
            container->append(key);
            container->append(QCborValue());
        }
        Q_ASSERT(index < container->elements.size());
        return { container, index };
    }